

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O2

void __thiscall kratos::MultipleDriverVisitor::~MultipleDriverVisitor(MultipleDriverVisitor *this)

{
  IRVisitor::~IRVisitor(&this->super_IRVisitor);
  operator_delete(this,0x48);
  return;
}

Assistant:

void visit(Generator* gen) override {
        auto var_names = gen->get_vars();
        for (auto const& name : var_names) {
            auto const& var = gen->get_var(name);
            check_var(var.get());
        }

        auto port_names = gen->get_port_names();
        for (auto const& name : port_names) {
            auto const& port = gen->get_port(name);
            check_var(port.get());
        }
    }